

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

char * getobjname(Proto *p,int lastpc,int reg,char **name)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  bool bVar11;
  
  pcVar3 = luaF_getlocalname(p,reg + 1,lastpc);
  *name = pcVar3;
  if (pcVar3 != (char *)0x0) {
    return "local";
  }
  if (lastpc < 1) {
    iVar2 = -1;
  }
  else {
    uVar5 = 0;
    uVar6 = 0xffffffff;
    iVar7 = 0;
    do {
      uVar4 = p->code[uVar5];
      uVar10 = uVar4 & 0x3f;
      uVar8 = uVar4 >> 6 & 0xff;
      if (uVar10 < 0x24) {
        if (uVar10 == 4) {
          if (((int)uVar8 <= reg) && (reg <= (int)(uVar8 + (uVar4 >> 0x17)))) goto LAB_001129b6;
        }
        else {
          if (uVar10 != 0x1e) goto LAB_001129a7;
          iVar9 = (int)uVar5 + (uVar4 >> 0xe) + -0x1fffe;
          iVar2 = iVar7;
          if (iVar7 < iVar9) {
            iVar2 = iVar9;
          }
          if ((long)iVar9 <= (long)uVar5) {
            iVar2 = iVar7;
          }
          if (iVar9 <= lastpc) {
            iVar7 = iVar2;
          }
        }
      }
      else {
        if (1 < uVar10 - 0x24) {
          if (uVar10 != 0x29) {
LAB_001129a7:
            if ((uVar8 == reg) && ((luaP_opmodes[uVar10] & 0x40) != 0)) goto LAB_001129b6;
            goto LAB_001129c5;
          }
          uVar8 = uVar8 + 2;
        }
        if ((int)uVar8 <= reg) {
LAB_001129b6:
          uVar6 = 0xffffffff;
          if ((long)iVar7 <= (long)uVar5) {
            uVar6 = uVar5 & 0xffffffff;
          }
        }
      }
LAB_001129c5:
      iVar2 = (int)uVar6;
      uVar5 = uVar5 + 1;
    } while ((uint)lastpc != uVar5);
  }
  if (iVar2 == -1) goto LAB_00112b45;
  uVar4 = p->code[iVar2];
  pcVar3 = (char *)(ulong)(uVar4 & 0x3f);
  bVar11 = true;
  switch(pcVar3) {
  case (char *)0x0:
    uVar8 = uVar4 >> 0x17;
    pcVar3 = (char *)(ulong)uVar8;
    bVar11 = (uVar4 >> 6 & 0xff) <= uVar8;
    if (bVar11) goto switchD_00112a06_caseD_3;
    pcVar3 = getobjname(p,iVar2,uVar8,name);
    break;
  case (char *)0x1:
    uVar4 = uVar4 >> 0xe;
    goto LAB_00112a83;
  case (char *)0x2:
    uVar4 = p->code[(long)iVar2 + 1] >> 6;
LAB_00112a83:
    pcVar3 = "constant";
    if ((*(uint *)((long)&p->k->tt_ + (ulong)(uVar4 << 4)) & 0xf) == 4) {
      *name = (char *)(*(long *)((long)&p->k->value_ + (ulong)(uVar4 << 4)) + 0x18);
      goto LAB_00112b3d;
    }
    break;
  default:
switchD_00112a06_caseD_3:
    break;
  case (char *)0x5:
    lVar1 = *(long *)((long)&p->upvalues->name + (ulong)(uVar4 >> 0x13 & 0xfffffff0));
    pcVar3 = "?";
    if (lVar1 != 0) {
      pcVar3 = (char *)(lVar1 + 0x18);
    }
    *name = pcVar3;
    pcVar3 = "upvalue";
    goto LAB_00112b3d;
  case (char *)0x6:
  case (char *)0x7:
    if ((uVar4 & 0x3f) == 7) {
      pcVar3 = luaF_getlocalname(p,(uVar4 >> 0x17) + 1,iVar2);
    }
    else {
      lVar1 = *(long *)((long)&p->upvalues->name + (ulong)((uVar4 >> 0x17) << 4));
      pcVar3 = "?";
      if (lVar1 != 0) {
        pcVar3 = (char *)(lVar1 + 0x18);
      }
    }
    kname(p,iVar2,uVar4 >> 0xe & 0x1ff,name);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = "field";
    }
    else {
      iVar2 = strcmp(pcVar3,"_ENV");
      pcVar3 = "field";
      if (iVar2 == 0) {
        pcVar3 = "global";
      }
    }
    goto LAB_00112b3d;
  case (char *)0xc:
    kname(p,iVar2,uVar4 >> 0xe & 0x1ff,name);
    pcVar3 = "method";
LAB_00112b3d:
    bVar11 = false;
  }
  if (bVar11) {
LAB_00112b45:
    pcVar3 = (char *)0x0;
  }
  return pcVar3;
}

Assistant:

static const char *getobjname (Proto *p, int lastpc, int reg,
                               const char **name) {
  int pc;
  *name = luaF_getlocalname(p, reg + 1, lastpc);
  if (*name)  /* is a local? */
    return "local";
  /* else try symbolic execution */
  pc = findsetreg(p, lastpc, reg);
  if (pc != -1) {  /* could find instruction? */
    Instruction i = p->code[pc];
    OpCode op = GET_OPCODE(i);
    switch (op) {
      case OP_MOVE: {
        int b = GETARG_B(i);  /* move from 'b' to 'a' */
        if (b < GETARG_A(i))
          return getobjname(p, pc, b, name);  /* get name for 'b' */
        break;
      }
      case OP_GETTABUP:
      case OP_GETTABLE: {
        int k = GETARG_C(i);  /* key index */
        int t = GETARG_B(i);  /* table index */
        const char *vn = (op == OP_GETTABLE)  /* name of indexed variable */
                         ? luaF_getlocalname(p, t + 1, pc)
                         : upvalname(p, t);
        kname(p, pc, k, name);
        return (vn && strcmp(vn, LUA_ENV) == 0) ? "global" : "field";
      }
      case OP_GETUPVAL: {
        *name = upvalname(p, GETARG_B(i));
        return "upvalue";
      }
      case OP_LOADK:
      case OP_LOADKX: {
        int b = (op == OP_LOADK) ? GETARG_Bx(i)
                                 : GETARG_Ax(p->code[pc + 1]);
        if (ttisstring(&p->k[b])) {
          *name = svalue(&p->k[b]);
          return "constant";
        }
        break;
      }
      case OP_SELF: {
        int k = GETARG_C(i);  /* key index */
        kname(p, pc, k, name);
        return "method";
      }
      default: break;  /* go through to return NULL */
    }
  }
  return NULL;  /* could not find reasonable name */
}